

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O2

void __thiscall Fl_Widget::do_callback(Fl_Widget *this,Fl_Widget *o,void *arg)

{
  Fl_Widget_Tracker wp;
  Fl_Widget_Tracker local_20;
  
  if (this->callback_ != (Fl_Callback *)0x0) {
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_20,this);
    (*this->callback_)(o,arg);
    if ((local_20.wp_ != (Fl_Widget *)0x0) && (this->callback_ != default_callback)) {
      *(byte *)&this->flags_ = (byte)this->flags_ & 0x7f;
    }
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_20);
  }
  return;
}

Assistant:

void
Fl_Widget::do_callback(Fl_Widget* o,void* arg) {
  if (!callback_) return;
  Fl_Widget_Tracker wp(this);
  callback_(o,arg);
  if (wp.deleted()) return;
  if (callback_ != default_callback)
    clear_changed();
}